

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int glfwGetMouseButton(GLFWwindow *handle,int button)

{
  _GLFWwindow *window;
  int button_local;
  GLFWwindow *handle_local;
  
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    handle_local._4_4_ = 0;
  }
  else if ((button < 0) || (7 < button)) {
    _glfwInputError(0x10003,"The specified mouse button is invalid");
    handle_local._4_4_ = 0;
  }
  else if (handle[(long)button + 0x5c] == (GLFWwindow)0x3) {
    handle[(long)button + 0x5c] = (GLFWwindow)0x0;
    handle_local._4_4_ = 1;
  }
  else {
    handle_local._4_4_ = (int)(char)handle[(long)button + 0x5c];
  }
  return handle_local._4_4_;
}

Assistant:

GLFWAPI int glfwGetMouseButton(GLFWwindow* handle, int button)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_RELEASE);

    if (button < 0 || button > GLFW_MOUSE_BUTTON_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM,
                        "The specified mouse button is invalid");
        return GLFW_RELEASE;
    }

    if (window->mouseButtons[button] == _GLFW_STICK)
    {
        // Sticky mode: release mouse button now
        window->mouseButtons[button] = GLFW_RELEASE;
        return GLFW_PRESS;
    }

    return (int) window->mouseButtons[button];
}